

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reload-archive-6-49.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  Issues issues;
  Issues local_28;
  
  local_28.super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Data649::loadArchive("../data/6-49/archive-all.txt",&local_28);
  if (bVar1) {
    iVar2 = 0;
    Data649::saveArchive("../data/6-49/archive-all.txt",&local_28);
  }
  else {
    main_cold_1();
    iVar2 = -1;
  }
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::~vector(&local_28);
  return iVar2;
}

Assistant:

int main() {
    Data649::Issues issues;

    if (loadArchive(PATH_ARCHIVE_6_49, issues) == false) {
        fprintf(stderr, "Failed to read archive data\n");
        return -1;
    }

    if (saveArchive(PATH_ARCHIVE_6_49, issues) == false) {
        fprintf(stderr, "Failed to save archive data\n");
        return -2;
    }

    return 0;
}